

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

int xmlSchemaVCheckCVCSimpleType
              (xmlSchemaAbstractCtxtPtr actxt,xmlNodePtr node,xmlSchemaTypePtr type,xmlChar *value,
              xmlSchemaValPtr *retVal,int fireErrors,int normalize,int isNormalized)

{
  xmlSchemaTypeType xVar1;
  uint uVar2;
  xmlSchemaTypePtr pxVar3;
  xmlGenericErrorFunc p_Var4;
  long lVar5;
  int iVar6;
  int iVar7;
  _xmlSchemaTypeLink *p_Var8;
  xmlGenericErrorFunc *pp_Var9;
  void **ppvVar10;
  ulong uVar11;
  xmlChar *pxVar12;
  byte *pbVar13;
  xmlChar *pxVar14;
  byte *pbVar15;
  xmlSchemaTypePtr item;
  xmlNodePtr node_00;
  xmlSchemaValPtr *ppxVar16;
  char *pcVar17;
  xmlParserErrors error;
  byte *pbVar18;
  xmlSchemaPtr schema;
  xmlSchemaValidCtxtPtr vctxt;
  byte *pbVar19;
  uint fireErrors_00;
  undefined4 in_register_0000008c;
  undefined8 uVar20;
  xmlSchemaValPtr pxVar21;
  long lVar22;
  byte bVar23;
  unsigned_long length;
  xmlSchemaValPtr val;
  uint local_7c;
  xmlSchemaTypePtr local_78;
  undefined8 local_70;
  xmlSchemaValPtr curVal;
  byte *local_60;
  byte *local_58;
  undefined8 local_50;
  xmlSchemaTypePtr local_48;
  xmlSchemaValPtr local_40;
  xmlSchemaValPtr *local_38;
  
  uVar20 = CONCAT44(in_register_0000008c,fireErrors);
  val = (xmlSchemaValPtr)0x0;
  local_70 = uVar20;
  local_38 = retVal;
  if (retVal == (xmlSchemaValPtr *)0x0) {
    bVar23 = (*(byte *)((long)&type->flags + 2) & 0x20) >> 5;
  }
  else {
    bVar23 = 1;
    if (*retVal != (xmlSchemaValPtr)0x0) {
      xmlSchemaFreeValue(*retVal);
      *retVal = (xmlSchemaValPtr)0x0;
    }
  }
  fireErrors_00 = (uint)uVar20;
  local_7c = (uint)bVar23;
  pbVar18 = (byte *)0x1e85c7;
  if (value != (xmlChar *)0x0) {
    pbVar18 = value;
  }
  xVar1 = type->type;
  if (((xVar1 == XML_SCHEMA_TYPE_BASIC) && (type->builtInType == 0x2e)) ||
     (uVar2 = type->flags, (uVar2 >> 8 & 1) != 0)) {
    pxVar3 = type;
    if ((isNormalized == 0) && ((normalize != 0 || ((type->flags & 0x10000000) != 0)))) {
      pbVar15 = xmlSchemaNormalizeValue(type,pbVar18);
      if (pbVar15 != (byte *)0x0) {
        pbVar18 = pbVar15;
      }
      xVar1 = type->type;
    }
    else {
      pbVar15 = (byte *)0x0;
    }
    while (xVar1 != XML_SCHEMA_TYPE_BASIC) {
      pxVar3 = pxVar3->baseType;
      if (pxVar3 == (xmlSchemaTypePtr)0x0) {
        pcVar17 = "could not get the built-in type";
        goto LAB_001a4f4c;
      }
      xVar1 = pxVar3->type;
    }
    if (actxt->type == 1) {
      if (pxVar3->builtInType != 0x1c) {
LAB_001a4a7f:
        if (local_7c == 0) {
          ppxVar16 = (xmlSchemaValPtr *)0x0;
        }
        else {
          ppxVar16 = &val;
        }
        iVar7 = xmlSchemaValPredefTypeNodeNoNorm(pxVar3,pbVar18,ppxVar16,node);
        goto LAB_001a4c21;
      }
      schema = *(xmlSchemaPtr *)(actxt + 4);
      vctxt = (xmlSchemaValidCtxtPtr)0x0;
      node_00 = node;
LAB_001a4a41:
      fireErrors_00 = local_7c;
      iVar7 = xmlSchemaValidateNotation(vctxt,schema,node_00,pbVar18,&val,local_7c);
LAB_001a4c21:
      if (iVar7 == 0) {
        error = XML_ERR_OK;
        if ((type->flags & 0x8000000) != 0) {
          iVar6 = xmlSchemaValidateFacets
                            (actxt,node,type,pxVar3->builtInType,pbVar18,val,0,(int)local_70);
          if (iVar6 != 0) {
            if (iVar6 < 0) {
              pcVar17 = "validating facets of atomic simple type";
              goto LAB_001a4f4c;
            }
            error = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2 - ((type->flags & 0x40) == 0);
          }
        }
      }
      else {
        if (iVar7 < 0) {
          pcVar17 = "validating against a built-in type";
LAB_001a4f4c:
          xmlSchemaInternalErr(actxt,"xmlSchemaVCheckCVCSimpleType",pcVar17);
          goto LAB_001a4f55;
        }
        error = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2 - ((type->flags & 0x40) == 0);
        if ((int)local_70 != 0) goto LAB_001a4e4c;
      }
LAB_001a4e51:
      if (pbVar15 != (byte *)0x0) {
        (*xmlFree)(pbVar15);
      }
      if (error != XML_ERR_OK) goto LAB_001a4f6e;
LAB_001a4e6a:
      if (local_38 != (xmlSchemaValPtr *)0x0) {
        *local_38 = val;
        return 0;
      }
      error = XML_ERR_OK;
      goto LAB_001a4f6e;
    }
    if (actxt->type == 2) {
      if (pxVar3->builtInType != 0x15) {
        if (pxVar3->builtInType != 0x1c) goto LAB_001a4a7f;
        schema = (xmlSchemaPtr)actxt[2].dummy;
        node_00 = (xmlNodePtr)0x0;
        vctxt = (xmlSchemaValidCtxtPtr)actxt;
        goto LAB_001a4a41;
      }
      curVal = (xmlSchemaValPtr)0x0;
      iVar6 = xmlValidateQName(pbVar18,1);
      if (iVar6 == 0) {
        local_78 = type;
        pbVar13 = xmlSchemaCollapseString(pbVar18);
        pbVar19 = pbVar13;
        if (pbVar13 == (byte *)0x0) {
          pbVar19 = pbVar18;
        }
        pxVar12 = xmlSplitQName2(pbVar19,(xmlChar **)&curVal);
        (*xmlFree)(pbVar13);
        if (pxVar12 == (xmlChar *)0x0) {
          pxVar12 = xmlStrdup(pbVar18);
        }
        pxVar14 = xmlSchemaLookupNamespace((xmlSchemaValidCtxtPtr)actxt,(xmlChar *)curVal);
        if ((curVal == (xmlSchemaValPtr)0x0) || ((*xmlFree)(curVal), pxVar14 != (xmlChar *)0x0)) {
          if (local_7c == 0) {
            (*xmlFree)(pxVar12);
          }
          else {
            if (pxVar14 == (xmlChar *)0x0) {
              iVar7 = 0;
              val = xmlSchemaNewQNameValue((xmlChar *)0x0,pxVar12);
              type = local_78;
              goto LAB_001a4c21;
            }
            pxVar14 = xmlStrdup(pxVar14);
            val = xmlSchemaNewQNameValue(pxVar14,pxVar12);
          }
          iVar7 = 0;
          type = local_78;
        }
        else {
          item = xmlSchemaGetBuiltInType(XML_SCHEMAS_QNAME);
          iVar7 = 0x720;
          pbVar19 = pbVar18;
          xmlSchemaCustomErr(actxt,XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_1,(xmlNodePtr)0x0,
                             (xmlSchemaBasicItemPtr)item,
                             "The QName value \'%s\' has no corresponding namespace declaration in scope"
                             ,pbVar18,(xmlChar *)0x0);
          fireErrors_00 = (uint)pbVar19;
          type = local_78;
          if (pxVar12 != (xmlChar *)0x0) {
            (*xmlFree)(pxVar12);
            type = local_78;
          }
        }
      }
      else {
        iVar7 = 0x720;
        if (iVar6 == -1) {
          xmlSchemaInternalErr(actxt,"xmlSchemaValidateQName","calling xmlValidateQName()");
          iVar7 = -1;
        }
      }
      goto LAB_001a4c21;
    }
    pp_Var9 = __xmlGenericError();
    p_Var4 = *pp_Var9;
    ppvVar10 = __xmlGenericErrorContext();
    (*p_Var4)(*ppvVar10,"Unimplemented block at %s:%d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/frida[P]libxml2/xmlschemas.c"
              ,0x6109);
LAB_001a4f55:
    if (pbVar15 != (byte *)0x0) {
      (*xmlFree)(pbVar15);
    }
  }
  else {
    if ((uVar2 & 0x40) != 0) {
      curVal = (xmlSchemaValPtr)0x0;
      local_60 = pbVar18;
      if (isNormalized == 0) {
        if ((uVar2 & 0x10000000) == 0 && normalize == 0) {
          local_50 = CONCAT71((uint7)(uint3)(xVar1 >> 8),1);
          goto LAB_001a4a02;
        }
        local_58 = xmlSchemaNormalizeValue(type,pbVar18);
        if (local_58 != (byte *)0x0) {
          local_60 = local_58;
        }
        local_50 = 0;
      }
      else {
        local_50 = 0;
LAB_001a4a02:
        local_58 = (byte *)0x0;
      }
      local_48 = type->subtypes;
      length = 0;
      local_40 = (xmlSchemaValPtr)0x0;
      pbVar18 = local_60;
      local_78 = type;
      do {
        while ((uVar11 = (ulong)*pbVar18, uVar11 < 0x21 &&
               ((0x100002600U >> (uVar11 & 0x3f) & 1) != 0))) {
          pbVar18 = pbVar18 + 1;
        }
        lVar22 = 0;
        while ((0x20 < (byte)uVar11 || ((0x100002601U >> (uVar11 & 0x3f) & 1) == 0))) {
          lVar5 = lVar22 + 1;
          lVar22 = lVar22 + 1;
          uVar11 = (ulong)pbVar18[lVar5];
        }
        if (lVar22 == 0) break;
        pxVar12 = xmlStrndup(pbVar18,(int)lVar22);
        if (local_7c == 0) {
          ppxVar16 = (xmlSchemaValPtr *)0x0;
        }
        else {
          ppxVar16 = &curVal;
        }
        fireErrors_00 = (uint)local_70;
        iVar6 = xmlSchemaVCheckCVCSimpleType(actxt,node,local_48,pxVar12,ppxVar16,fireErrors_00,0,1)
        ;
        if (pxVar12 != (xmlChar *)0x0) {
          (*xmlFree)(pxVar12);
        }
        if (curVal != (xmlSchemaValPtr)0x0) {
          if (val == (xmlSchemaValPtr)0x0) {
            val = curVal;
            local_40 = curVal;
          }
          else {
            xmlSchemaValueAppend(local_40,curVal);
            local_40 = curVal;
          }
          curVal = (xmlSchemaValPtr)0x0;
        }
        if (iVar6 != 0) {
          type = local_78;
          if (-1 < iVar6) goto LAB_001a4d1a;
          pcVar17 = "validating an item of list simple type";
          pbVar15 = local_58;
          goto LAB_001a4f4c;
        }
        pbVar18 = pbVar18 + lVar22;
        length = length + 1;
      } while (*pbVar18 != 0);
      type = local_78;
      error = XML_ERR_OK;
      pbVar15 = local_58;
      if ((local_78->flags & 0x8000000) != 0) {
        error = XML_ERR_OK;
        pxVar21 = val;
        iVar6 = xmlSchemaValidateFacets
                          (actxt,node,local_78,XML_SCHEMAS_UNKNOWN,local_60,val,length,(int)local_70
                          );
        fireErrors_00 = (uint)pxVar21;
        pbVar15 = local_58;
        if (iVar6 == 0) goto LAB_001a4e51;
        if (iVar6 < 0) {
          pcVar17 = "validating facets of list simple type";
          goto LAB_001a4f4c;
        }
LAB_001a4d1a:
        pbVar18 = local_60;
        pbVar15 = local_58;
        if ((int)local_70 == 0) {
          error = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2;
          goto LAB_001a4e51;
        }
        if (((char)local_50 != '\0') &&
           (pbVar15 = xmlSchemaNormalizeValue(type,local_60), pbVar15 != (byte *)0x0)) {
          pbVar18 = pbVar15;
        }
        error = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2;
LAB_001a4e4c:
        xmlSchemaSimpleTypeErr(actxt,error,node,pbVar18,type,fireErrors_00);
      }
      goto LAB_001a4e51;
    }
    if (-1 < (char)uVar2) goto LAB_001a4e6a;
    p_Var8 = xmlSchemaGetUnionSimpleTypeMemberTypes(type);
    if (p_Var8 != (xmlSchemaTypeLinkPtr)0x0) {
      iVar6 = 0;
      for (; fireErrors_00 = (uint)uVar20, p_Var8 != (xmlSchemaTypeLinkPtr)0x0;
          p_Var8 = p_Var8->next) {
        ppxVar16 = &val;
        if (local_7c == 0) {
          ppxVar16 = (xmlSchemaValPtr *)0x0;
        }
        uVar20 = 0;
        iVar6 = xmlSchemaVCheckCVCSimpleType(actxt,node,p_Var8->type,pbVar18,ppxVar16,0,1,0);
        fireErrors_00 = (uint)uVar20;
        if (iVar6 < 1) break;
      }
      if (iVar6 != 0) {
        if (iVar6 < 0) {
          pcVar17 = "validating members of union simple type";
          goto LAB_001a4f33;
        }
        pbVar15 = (byte *)0x0;
LAB_001a4d62:
        if ((int)local_70 != 0) {
          error = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_3;
          goto LAB_001a4e4c;
        }
        error = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_3;
        goto LAB_001a4e51;
      }
      if (((uint)type->flags >> 0x1b & 1) == 0) goto LAB_001a4e6a;
      error = XML_ERR_OK;
      if ((isNormalized == 0) && ((type->flags & 0x10000000U) != 0 || normalize != 0)) {
        pbVar15 = xmlSchemaNormalizeValue(p_Var8->type,pbVar18);
        if (pbVar15 != (byte *)0x0) {
          pbVar18 = pbVar15;
        }
      }
      else {
        pbVar15 = (byte *)0x0;
      }
      pxVar21 = val;
      iVar6 = xmlSchemaValidateFacets
                        (actxt,node,type,XML_SCHEMAS_UNKNOWN,pbVar18,val,0,(int)local_70);
      fireErrors_00 = (uint)pxVar21;
      if (iVar6 == 0) goto LAB_001a4e51;
      if (-1 < iVar6) goto LAB_001a4d62;
      pcVar17 = "validating facets of union simple type";
      goto LAB_001a4f4c;
    }
    pcVar17 = "union simple type has no member types";
LAB_001a4f33:
    xmlSchemaInternalErr(actxt,"xmlSchemaVCheckCVCSimpleType",pcVar17);
  }
  error = ~XML_ERR_OK;
LAB_001a4f6e:
  if (val != (xmlSchemaValPtr)0x0) {
    xmlSchemaFreeValue(val);
  }
  return error;
}

Assistant:

static int
xmlSchemaVCheckCVCSimpleType(xmlSchemaAbstractCtxtPtr actxt,
			     xmlNodePtr node,
			     xmlSchemaTypePtr type,
			     const xmlChar *value,
			     xmlSchemaValPtr *retVal,
			     int fireErrors,
			     int normalize,
			     int isNormalized)
{
    int ret = 0, valNeeded = (retVal) ? 1 : 0;
    xmlSchemaValPtr val = NULL;
    /* xmlSchemaWhitespaceValueType ws; */
    xmlChar *normValue = NULL;

#define NORMALIZE(atype) \
    if ((! isNormalized) && \
    (normalize || (type->flags & XML_SCHEMAS_TYPE_NORMVALUENEEDED))) { \
	normValue = xmlSchemaNormalizeValue(atype, value); \
	if (normValue != NULL) \
	    value = normValue; \
	isNormalized = 1; \
    }

    if ((retVal != NULL) && (*retVal != NULL)) {
	xmlSchemaFreeValue(*retVal);
	*retVal = NULL;
    }
    /*
    * 3.14.4 Simple Type Definition Validation Rules
    * Validation Rule: String Valid
    */
    /*
    * 1 It is schema-valid with respect to that definition as defined
    * by Datatype Valid in [XML Schemas: Datatypes].
    */
    /*
    * 2.1 If The definition is ENTITY or is validly derived from ENTITY given
    * the empty set, as defined in Type Derivation OK (Simple) ($3.14.6), then
    * the string must be a `declared entity name`.
    */
    /*
    * 2.2 If The definition is ENTITIES or is validly derived from ENTITIES
    * given the empty set, as defined in Type Derivation OK (Simple) ($3.14.6),
    * then every whitespace-delimited substring of the string must be a `declared
    * entity name`.
    */
    /*
    * 2.3 otherwise no further condition applies.
    */
    if ((! valNeeded) && (type->flags & XML_SCHEMAS_TYPE_FACETSNEEDVALUE))
	valNeeded = 1;
    if (value == NULL)
	value = BAD_CAST "";
    if (WXS_IS_ANY_SIMPLE_TYPE(type) || WXS_IS_ATOMIC(type)) {
	xmlSchemaTypePtr biType; /* The built-in type. */
	/*
	* SPEC (1.2.1) "if {variety} is `atomic` then the string must `match`
	* a literal in the `lexical space` of {base type definition}"
	*/
	/*
	* Whitespace-normalize.
	*/
	NORMALIZE(type);
	if (type->type != XML_SCHEMA_TYPE_BASIC) {
	    /*
	    * Get the built-in type.
	    */
	    biType = type->baseType;
	    while ((biType != NULL) &&
		(biType->type != XML_SCHEMA_TYPE_BASIC))
		biType = biType->baseType;

	    if (biType == NULL) {
		AERROR_INT("xmlSchemaVCheckCVCSimpleType",
		    "could not get the built-in type");
		goto internal_error;
	    }
	} else
	    biType = type;
	/*
	* NOTATIONs need to be processed here, since they need
	* to lookup in the hashtable of NOTATION declarations of the schema.
	*/
	if (actxt->type == XML_SCHEMA_CTXT_VALIDATOR) {
	    switch (biType->builtInType) {
		case XML_SCHEMAS_NOTATION:
		    ret = xmlSchemaValidateNotation(
			(xmlSchemaValidCtxtPtr) actxt,
			((xmlSchemaValidCtxtPtr) actxt)->schema,
			NULL, value, &val, valNeeded);
		    break;
		case XML_SCHEMAS_QNAME:
		    ret = xmlSchemaValidateQName((xmlSchemaValidCtxtPtr) actxt,
			value, &val, valNeeded);
		    break;
		default:
		    /* ws = xmlSchemaGetWhiteSpaceFacetValue(type); */
		    if (valNeeded)
			ret = xmlSchemaValPredefTypeNodeNoNorm(biType,
			    value, &val, node);
		    else
			ret = xmlSchemaValPredefTypeNodeNoNorm(biType,
			    value, NULL, node);
		    break;
	    }
	} else if (actxt->type == XML_SCHEMA_CTXT_PARSER) {
	    switch (biType->builtInType) {
		case XML_SCHEMAS_NOTATION:
		    ret = xmlSchemaValidateNotation(NULL,
			((xmlSchemaParserCtxtPtr) actxt)->schema, node,
			value, &val, valNeeded);
		    break;
		default:
		    /* ws = xmlSchemaGetWhiteSpaceFacetValue(type); */
		    if (valNeeded)
			ret = xmlSchemaValPredefTypeNodeNoNorm(biType,
			    value, &val, node);
		    else
			ret = xmlSchemaValPredefTypeNodeNoNorm(biType,
			    value, NULL, node);
		    break;
	    }
	} else {
	    /*
	    * Validation via a public API is not implemented yet.
	    */
	    TODO
	    goto internal_error;
	}
	if (ret != 0) {
	    if (ret < 0) {
		AERROR_INT("xmlSchemaVCheckCVCSimpleType",
		    "validating against a built-in type");
		goto internal_error;
	    }
	    if (WXS_IS_LIST(type))
		ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2;
	    else
		ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_1;
	}
	if ((ret == 0) && (type->flags & XML_SCHEMAS_TYPE_HAS_FACETS)) {
	    /*
	    * Check facets.
	    */
	    ret = xmlSchemaValidateFacets(actxt, node, type,
		(xmlSchemaValType) biType->builtInType, value, val,
		0, fireErrors);
	    if (ret != 0) {
		if (ret < 0) {
		    AERROR_INT("xmlSchemaVCheckCVCSimpleType",
			"validating facets of atomic simple type");
		    goto internal_error;
		}
		if (WXS_IS_LIST(type))
		    ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2;
		else
		    ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_1;
	    }
	}
	else if (fireErrors && (ret > 0))
	    xmlSchemaSimpleTypeErr(actxt, ret, node, value, type, 1);
    } else if (WXS_IS_LIST(type)) {

	xmlSchemaTypePtr itemType;
	const xmlChar *cur, *end;
	xmlChar *tmpValue = NULL;
	unsigned long len = 0;
	xmlSchemaValPtr prevVal = NULL, curVal = NULL;
	/* 1.2.2 if {variety} is `list` then the string must be a sequence
	* of white space separated tokens, each of which `match`es a literal
	* in the `lexical space` of {item type definition}
	*/
	/*
	* Note that XML_SCHEMAS_TYPE_NORMVALUENEEDED will be set if
	* the list type has an enum or pattern facet.
	*/
	NORMALIZE(type);
	/*
	* VAL TODO: Optimize validation of empty values.
	* VAL TODO: We do not have computed values for lists.
	*/
	itemType = WXS_LIST_ITEMTYPE(type);
	cur = value;
	do {
	    while (IS_BLANK_CH(*cur))
		cur++;
	    end = cur;
	    while ((*end != 0) && (!(IS_BLANK_CH(*end))))
		end++;
	    if (end == cur)
		break;
	    tmpValue = xmlStrndup(cur, end - cur);
	    len++;

	    if (valNeeded)
		ret = xmlSchemaVCheckCVCSimpleType(actxt, node, itemType,
		    tmpValue, &curVal, fireErrors, 0, 1);
	    else
		ret = xmlSchemaVCheckCVCSimpleType(actxt, node, itemType,
		    tmpValue, NULL, fireErrors, 0, 1);
	    FREE_AND_NULL(tmpValue);
	    if (curVal != NULL) {
		/*
		* Add to list of computed values.
		*/
		if (val == NULL)
		    val = curVal;
		else
		    xmlSchemaValueAppend(prevVal, curVal);
		prevVal = curVal;
		curVal = NULL;
	    }
	    if (ret != 0) {
		if (ret < 0) {
		    AERROR_INT("xmlSchemaVCheckCVCSimpleType",
			"validating an item of list simple type");
		    goto internal_error;
		}
		ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2;
		break;
	    }
	    cur = end;
	} while (*cur != 0);
	FREE_AND_NULL(tmpValue);
	if ((ret == 0) && (type->flags & XML_SCHEMAS_TYPE_HAS_FACETS)) {
	    /*
	    * Apply facets (pattern, enumeration).
	    */
	    ret = xmlSchemaValidateFacets(actxt, node, type,
		XML_SCHEMAS_UNKNOWN, value, val,
		len, fireErrors);
	    if (ret != 0) {
		if (ret < 0) {
		    AERROR_INT("xmlSchemaVCheckCVCSimpleType",
			"validating facets of list simple type");
		    goto internal_error;
		}
		ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2;
	    }
	}
	if (fireErrors && (ret > 0)) {
	    /*
	    * Report the normalized value.
	    */
	    normalize = 1;
	    NORMALIZE(type);
	    xmlSchemaSimpleTypeErr(actxt, ret, node, value, type, 1);
	}
    } else if (WXS_IS_UNION(type)) {
	xmlSchemaTypeLinkPtr memberLink;
	/*
	* TODO: For all datatypes `derived` by `union`  whiteSpace does
	* not apply directly; however, the normalization behavior of `union`
	* types is controlled by the value of whiteSpace on that one of the
	* `memberTypes` against which the `union` is successfully validated.
	*
	* This means that the value is normalized by the first validating
	* member type, then the facets of the union type are applied. This
	* needs changing of the value!
	*/

	/*
	* 1.2.3 if {variety} is `union` then the string must `match` a
	* literal in the `lexical space` of at least one member of
	* {member type definitions}
	*/
	memberLink = xmlSchemaGetUnionSimpleTypeMemberTypes(type);
	if (memberLink == NULL) {
	    AERROR_INT("xmlSchemaVCheckCVCSimpleType",
		"union simple type has no member types");
	    goto internal_error;
	}
	/*
	* Always normalize union type values, since we currently
	* cannot store the whitespace information with the value
	* itself; otherwise a later value-comparison would be
	* not possible.
	*/
	while (memberLink != NULL) {
	    if (valNeeded)
		ret = xmlSchemaVCheckCVCSimpleType(actxt, node,
		    memberLink->type, value, &val, 0, 1, 0);
	    else
		ret = xmlSchemaVCheckCVCSimpleType(actxt, node,
		    memberLink->type, value, NULL, 0, 1, 0);
	    if (ret <= 0)
		break;
	    memberLink = memberLink->next;
	}
	if (ret != 0) {
	    if (ret < 0) {
		AERROR_INT("xmlSchemaVCheckCVCSimpleType",
		    "validating members of union simple type");
		goto internal_error;
	    }
	    ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_3;
	}
	/*
	* Apply facets (pattern, enumeration).
	*/
	if ((ret == 0) && (type->flags & XML_SCHEMAS_TYPE_HAS_FACETS)) {
	    /*
	    * The normalization behavior of `union` types is controlled by
	    * the value of whiteSpace on that one of the `memberTypes`
	    * against which the `union` is successfully validated.
	    */
	    NORMALIZE(memberLink->type);
	    ret = xmlSchemaValidateFacets(actxt, node, type,
		XML_SCHEMAS_UNKNOWN, value, val,
		0, fireErrors);
	    if (ret != 0) {
		if (ret < 0) {
		    AERROR_INT("xmlSchemaVCheckCVCSimpleType",
			"validating facets of union simple type");
		    goto internal_error;
		}
		ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_3;
	    }
	}
	if (fireErrors && (ret > 0))
	    xmlSchemaSimpleTypeErr(actxt, ret, node, value, type, 1);
    }

    if (normValue != NULL)
	xmlFree(normValue);
    if (ret == 0) {
	if (retVal != NULL)
	    *retVal = val;
	else if (val != NULL)
	    xmlSchemaFreeValue(val);
    } else if (val != NULL)
	xmlSchemaFreeValue(val);
    return (ret);
internal_error:
    if (normValue != NULL)
	xmlFree(normValue);
    if (val != NULL)
	xmlSchemaFreeValue(val);
    return (-1);
}